

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutOracle.c
# Opt level: O1

Cut_Cut_t * Cut_CutTriv(Cut_Oracle_t *p,int Node)

{
  uint uVar1;
  Cut_Cut_t *pCVar2;
  long lVar3;
  
  pCVar2 = Cut_CutStart(p);
  uVar1 = *(uint *)pCVar2;
  *(uint *)pCVar2 = uVar1 & 0xfffffff | 0x10000000;
  *(int *)(pCVar2 + 1) = Node;
  if ((p->pParams->fTruth != 0) && (0 < p->nTruthWords)) {
    lVar3 = 0;
    do {
      *(undefined4 *)(&pCVar2[1].field_0x0 + lVar3 * 4 + (ulong)(uVar1 >> 0x16 & 0x3c)) = 0xaaaaaaaa
      ;
      lVar3 = lVar3 + 1;
    } while (lVar3 < p->nTruthWords);
  }
  p->nCutsTriv = p->nCutsTriv + 1;
  return pCVar2;
}

Assistant:

Cut_Cut_t * Cut_CutTriv( Cut_Oracle_t * p, int Node )
{
    Cut_Cut_t * pCut;
    pCut = Cut_CutStart( p );
    pCut->nLeaves    = 1;
    pCut->pLeaves[0] = Node;
    if ( p->pParams->fTruth )
    {
        unsigned * pTruth = Cut_CutReadTruth(pCut);
        int i;
        for ( i = 0; i < p->nTruthWords; i++ )
            pTruth[i] = 0xAAAAAAAA;
    }
    p->nCutsTriv++;
    return pCut;
}